

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
HelpGameCommand::trigger
          (HelpGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  int iVar1;
  int iVar2;
  Server *pSVar3;
  undefined1 auVar4 [16];
  Server *source_local;
  uint cmdCount;
  GameCommand *cmd;
  anon_class_24_3_c4a9eb0b getAccessCommands;
  string local_90;
  string msg;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  
  msg._M_string_length = (size_type)parameters._M_str;
  msg._M_dataplus._M_p = (pointer)parameters._M_len;
  getAccessCommands.source = &source_local;
  getAccessCommands.cmdCount = &cmdCount;
  cmdCount = 0;
  getAccessCommands.cmd = &cmd;
  local_90._M_dataplus._M_p = (pointer)0x2;
  local_90._M_string_length = 0x13bb6d;
  source_local = source;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&msg,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_90);
  if (split_parameters.first._M_len == 0) {
    for (iVar2 = 0; iVar2 <= player->access; iVar2 = iVar2 + 1) {
      trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)::
      $_0::operator()[abi_cxx11_(&msg,&getAccessCommands,iVar2);
      pSVar3 = source_local;
      if (msg._M_string_length != 0) {
        trigger(RenX::Server*,RenX::PlayerInfo*,std::basic_string_view<char,std::char_traits<char>>)
        ::$_0::operator()[abi_cxx11_(&local_90,&getAccessCommands,iVar2);
        RenX::Server::sendMessage(pSVar3,player,local_90._M_string_length,local_90._M_dataplus._M_p)
        ;
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    if (cmdCount != 0) {
      return;
    }
    auVar4._8_8_ = "No listed commands available.";
    auVar4._0_8_ = 0x1d;
    pSVar3 = source_local;
  }
  else {
    cmd = (GameCommand *)
          RenX::Server::getCommand
                    (source_local,split_parameters.first._M_len,split_parameters.first._M_str);
    if (cmd == (GameCommand *)0x0) {
      auVar4._8_8_ = "Error: Command not found.";
      auVar4._0_8_ = 0x19;
      pSVar3 = source_local;
    }
    else {
      iVar2 = player->access;
      iVar1 = RenX::GameCommand::getAccessLevel();
      pSVar3 = source_local;
      if (iVar2 < iVar1) {
        auVar4._8_8_ = "Access Denied.";
        auVar4._0_8_ = 0xe;
      }
      else {
        auVar4 = (*(code *)**(undefined8 **)cmd)
                           (cmd,split_parameters.second._M_len,split_parameters.second._M_str);
      }
    }
  }
  RenX::Server::sendMessage(pSVar3,player,auVar4._0_8_,auVar4._8_8_);
  return;
}

Assistant:

void HelpGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	RenX::GameCommand *cmd;
	unsigned int cmdCount = 0;
	auto getAccessCommands = [&](int accessLevel) {
		std::string list;
		unsigned int i = 0;
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list = "Access level "s + std::to_string(accessLevel) + " commands: "s;
				list += cmd->getTrigger();
				break;
			}
		}
		while (i != source->getCommandCount()) {
			cmd = source->getCommand(i++);
			if (cmd->getAccessLevel() == accessLevel) {
				cmdCount++;
				list += ", ";
				list += cmd->getTrigger();
			}
		}
		return list;
	};

	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.first.empty()) {
		for (int i = 0; i <= player->access; i++) {
			auto msg = getAccessCommands(i);
			if (!msg.empty()) {
				source->sendMessage(*player, getAccessCommands(i));
			}
		}
		if (cmdCount == 0) {
			source->sendMessage(*player, "No listed commands available."sv);
		}
	}
	else {
		cmd = source->getCommand(split_parameters.first);
		if (cmd != nullptr) {
			if (player->access >= cmd->getAccessLevel()) {
				source->sendMessage(*player, cmd->getHelp(split_parameters.second));
			}
			else {
				source->sendMessage(*player, "Access Denied."sv);
			}
		}
		else {
			source->sendMessage(*player, "Error: Command not found."sv);
		}
	}
}